

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VMOV_to_gp(DisasContext_conflict1 *s,arg_VMOV_to_gp *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 ret;
  uint uVar2;
  uint uVar3;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (a->size == 2) {
    uVar2 = s->isar->mvfr0;
    if ((uVar2 & 0xf0) == 0) {
      return false;
    }
  }
  else {
    if ((s->features & 0x100) == 0) {
      return false;
    }
    uVar2 = s->isar->mvfr0;
  }
  if (((uVar2 & 0xe) == 0) && ((a->vn & 0x10) != 0)) {
    return false;
  }
  uVar2 = a->index << ((byte)a->size & 0x1f);
  _Var1 = full_vfp_access_check(s,false);
  if (_Var1) {
    uVar3 = uVar2 & 3;
    ret = neon_load_reg(tcg_ctx,a->vn,uVar2 >> 2 & 1);
    if (a->size == 1) {
      if (a->u == 0) {
        if (uVar3 == 0) {
          tcg_gen_ext16s_i32_aarch64(tcg_ctx,ret,ret);
        }
        else {
          tcg_gen_sari_i32_aarch64(tcg_ctx,ret,ret,0x10);
        }
      }
      else if (uVar3 == 0) {
        tcg_gen_ext16u_i32_aarch64(tcg_ctx,ret,ret);
      }
      else {
        tcg_gen_shri_i32_aarch64(tcg_ctx,ret,ret,0x10);
      }
    }
    else if (a->size == 0) {
      if (uVar3 != 0) {
        tcg_gen_shri_i32_aarch64(tcg_ctx,ret,ret,uVar3 << 3);
      }
      if (a->u == 0) {
        tcg_gen_ext8s_i32_aarch64(tcg_ctx,ret,ret);
      }
      else {
        tcg_gen_ext8u_i32_aarch64(tcg_ctx,ret,ret);
      }
    }
    store_reg(s,a->rt,ret);
    return true;
  }
  return true;
}

Assistant:

static bool trans_VMOV_to_gp(DisasContext *s, arg_VMOV_to_gp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* VMOV scalar to general purpose register */
    TCGv_i32 tmp;
    int pass;
    uint32_t offset;

    /* SIZE == 2 is a VFP instruction; otherwise NEON.  */
    if (a->size == 2
        ? !dc_isar_feature(aa32_fpsp_v2, s)
        : !arm_dc_feature(s, ARM_FEATURE_NEON)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vn & 0x10)) {
        return false;
    }

    offset = a->index << a->size;
    pass = extract32(offset, 2, 1);
    offset = extract32(offset, 0, 2) * 8;

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = neon_load_reg(tcg_ctx, a->vn, pass);
    switch (a->size) {
    case 0:
        if (offset) {
            tcg_gen_shri_i32(tcg_ctx, tmp, tmp, offset);
        }
        if (a->u) {
            gen_uxtb(tmp);
        } else {
            gen_sxtb(tmp);
        }
        break;
    case 1:
        if (a->u) {
            if (offset) {
                tcg_gen_shri_i32(tcg_ctx, tmp, tmp, 16);
            } else {
                gen_uxth(tmp);
            }
        } else {
            if (offset) {
                tcg_gen_sari_i32(tcg_ctx, tmp, tmp, 16);
            } else {
                gen_sxth(tmp);
            }
        }
        break;
    case 2:
        break;
    }
    store_reg(s, a->rt, tmp);

    return true;
}